

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::emplace<QXdgDBusImageStruct_const&>
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,QXdgDBusImageStruct *args)

{
  QXdgDBusImageStruct **ppQVar1;
  QXdgDBusImageStruct *pQVar2;
  undefined4 uVar3;
  Data *pDVar4;
  QXdgDBusImageStruct *pQVar5;
  undefined4 uVar9;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  int iVar10;
  qsizetype *pqVar11;
  bool bVar12;
  
  pDVar4 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
           super_QArrayDataPointer<QXdgDBusImageStruct>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0064d836:
    uVar3 = args->width;
    uVar9 = args->height;
    pDVar6 = (args->data).d.d;
    pcVar7 = (args->data).d.ptr;
    qVar8 = (args->data).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar12 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.size != 0;
    QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
              ((QArrayDataPointer<QXdgDBusImageStruct> *)this,(uint)(i == 0 && bVar12),1,
               (QXdgDBusImageStruct **)0x0,(QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
    if (i != 0 || !bVar12) {
      pQVar2 = pQVar5 + i;
      memmove(pQVar2 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
               super_QArrayDataPointer<QXdgDBusImageStruct>.size - i) * 0x20);
      pQVar2->width = uVar3;
      pQVar2->height = uVar9;
      (pQVar2->data).d.d = pDVar6;
      (pQVar2->data).d.ptr = pcVar7;
      (pQVar2->data).d.size = qVar8;
      goto LAB_0064d8ee;
    }
    pQVar5[-1].width = uVar3;
    pQVar5[-1].height = uVar9;
    pQVar5[-1].data.d.d = pDVar6;
    pQVar5[-1].data.d.ptr = pcVar7;
    pQVar5[-1].data.d.size = qVar8;
  }
  else {
    if (((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
         super_QArrayDataPointer<QXdgDBusImageStruct>.size == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr,
       (pDVar4->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      iVar10 = args->height;
      pQVar5[i].width = args->width;
      pQVar5[i].height = iVar10;
      pDVar6 = (args->data).d.d;
      pQVar5[i].data.d.d = pDVar6;
      pQVar5[i].data.d.ptr = (args->data).d.ptr;
      pQVar5[i].data.d.size = (args->data).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0064d8ee;
    }
    if ((i != 0) ||
       (pQVar5 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr,
       (QXdgDBusImageStruct *)
       ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar5))
    goto LAB_0064d836;
    iVar10 = args->height;
    pQVar5[-1].width = args->width;
    pQVar5[-1].height = iVar10;
    pDVar6 = (args->data).d.d;
    pQVar5[-1].data.d.d = pDVar6;
    pQVar5[-1].data.d.ptr = (args->data).d.ptr;
    pQVar5[-1].data.d.size = (args->data).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0064d8ee:
  pqVar11 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
             super_QArrayDataPointer<QXdgDBusImageStruct>.size;
  *pqVar11 = *pqVar11 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }